

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::EnumDescriptorProto_EnumReservedRange::_InternalParse
          (EnumDescriptorProto_EnumReservedRange *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  UnknownFieldSet *unknown;
  byte *p;
  uint uVar5;
  pair<const_char_*,_unsigned_int> pVar6;
  byte *local_38;
  
  local_38 = (byte *)ptr;
  bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  uVar4 = 0;
  if (!bVar3) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    uVar4 = 0;
    do {
      bVar1 = *local_38;
      uVar5 = (uint)bVar1;
      p = local_38 + 1;
      if ((char)bVar1 < '\0') {
        uVar5 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar6 = internal::ReadTagFallback((char *)local_38,uVar5);
          p = (byte *)pVar6.first;
          uVar5 = pVar6.second;
        }
        else {
          p = local_38 + 2;
        }
      }
      local_38 = p;
      if (uVar5 >> 3 == 2) {
        if ((char)uVar5 != '\x10') goto LAB_00372f8e;
        uVar4 = uVar4 | 2;
        bVar1 = *p;
        uVar5 = (uint)bVar1;
        local_38 = p + 1;
        if ((char)bVar1 < '\0') {
          uVar5 = ((uint)bVar1 + (uint)*local_38 * 0x80) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar6 = internal::VarintParseSlow32((char *)p,uVar5);
            local_38 = (byte *)pVar6.first;
            this->end_ = pVar6.second;
            goto LAB_00372fc5;
          }
          local_38 = p + 2;
        }
        this->end_ = uVar5;
      }
      else {
        if ((uVar5 >> 3 != 1) || ((char)uVar5 != '\b')) {
LAB_00372f8e:
          if ((uVar5 == 0) || ((uVar5 & 7) == 4)) {
            if (p != (byte *)0x0) {
              (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar5 - 1;
              break;
            }
          }
          else {
            uVar2 = this_00->ptr_;
            if ((uVar2 & 1) == 0) {
              unknown = internal::InternalMetadata::
                        mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
            }
            else {
              unknown = (UnknownFieldSet *)((uVar2 & 0xfffffffffffffffc) + 8);
            }
            local_38 = (byte *)internal::UnknownFieldParse
                                         ((ulong)uVar5,unknown,(char *)local_38,ctx);
LAB_00372fc5:
            if (local_38 != (byte *)0x0) goto LAB_00372fca;
          }
          local_38 = (byte *)0x0;
          break;
        }
        uVar4 = uVar4 | 1;
        bVar1 = *p;
        uVar5 = (uint)bVar1;
        local_38 = p + 1;
        if ((char)bVar1 < '\0') {
          uVar5 = ((uint)bVar1 + (uint)*local_38 * 0x80) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar6 = internal::VarintParseSlow32((char *)p,uVar5);
            local_38 = (byte *)pVar6.first;
            this->start_ = pVar6.second;
            goto LAB_00372fc5;
          }
          local_38 = p + 2;
        }
        this->start_ = uVar5;
      }
LAB_00372fca:
      bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar3);
  }
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar4;
  return (char *)local_38;
}

Assistant:

const char* EnumDescriptorProto_EnumReservedRange::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional int32 start = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          _Internal::set_has_start(&has_bits);
          start_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional int32 end = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}